

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O3

void CB_ADF::finish(cb_adf *data)

{
  pointer ppeVar1;
  label *__ptr;
  void *__ptr_00;
  wclass *pwVar2;
  uint *puVar3;
  action_score *paVar4;
  ulong uVar5;
  undefined8 *puVar6;
  label *__ptr_01;
  long lVar7;
  
  ppeVar1 = (data->gen_cs).mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppeVar1 != (pointer)0x0) {
    operator_delete(ppeVar1);
  }
  __ptr = (data->cb_labels)._begin;
  if (__ptr != (label *)0x0) {
    free(__ptr);
  }
  (data->cb_labels)._begin = (label *)0x0;
  (data->cb_labels)._end = (label *)0x0;
  (data->cb_labels).end_array = (label *)0x0;
  __ptr_01 = (data->prepped_cs_labels)._begin;
  if ((data->prepped_cs_labels)._end != __ptr_01) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      __ptr_00 = *(void **)((long)&(__ptr_01->costs)._begin + lVar7);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      puVar6 = (undefined8 *)((long)&(__ptr_01->costs)._begin + lVar7);
      *puVar6 = 0;
      puVar6[1] = 0;
      puVar6[2] = 0;
      uVar5 = uVar5 + 1;
      __ptr_01 = (data->prepped_cs_labels)._begin;
      lVar7 = lVar7 + 0x20;
    } while (uVar5 < (ulong)((long)(data->prepped_cs_labels)._end - (long)__ptr_01 >> 5));
  }
  if (__ptr_01 != (label *)0x0) {
    free(__ptr_01);
  }
  (data->prepped_cs_labels)._begin = (label *)0x0;
  (data->prepped_cs_labels)._end = (label *)0x0;
  (data->prepped_cs_labels).end_array = (label *)0x0;
  pwVar2 = (data->cs_labels).costs._begin;
  if (pwVar2 != (wclass *)0x0) {
    free(pwVar2);
  }
  (data->cs_labels).costs._begin = (wclass *)0x0;
  (data->cs_labels).costs._end = (wclass *)0x0;
  (data->cs_labels).costs.end_array = (wclass *)0x0;
  puVar3 = (data->backup_weights)._begin;
  if (puVar3 != (uint *)0x0) {
    free(puVar3);
  }
  (data->backup_weights)._begin = (uint *)0x0;
  (data->backup_weights)._end = (uint *)0x0;
  (data->backup_weights).end_array = (uint *)0x0;
  puVar3 = (data->backup_nf)._begin;
  if (puVar3 != (uint *)0x0) {
    free(puVar3);
  }
  (data->backup_nf)._begin = (uint *)0x0;
  (data->backup_nf)._end = (uint *)0x0;
  (data->backup_nf).end_array = (uint *)0x0;
  paVar4 = (data->prob_s)._begin;
  if (paVar4 != (action_score *)0x0) {
    free(paVar4);
  }
  (data->prob_s)._begin = (action_score *)0x0;
  (data->prob_s)._end = (action_score *)0x0;
  (data->prob_s).end_array = (action_score *)0x0;
  paVar4 = (data->a_s)._begin;
  if (paVar4 != (action_score *)0x0) {
    free(paVar4);
  }
  (data->a_s)._begin = (action_score *)0x0;
  (data->a_s)._end = (action_score *)0x0;
  (data->a_s).end_array = (action_score *)0x0;
  pwVar2 = (data->gen_cs).pred_scores.costs._begin;
  if (pwVar2 != (wclass *)0x0) {
    free(pwVar2);
  }
  (data->gen_cs).pred_scores.costs._begin = (wclass *)0x0;
  (data->gen_cs).pred_scores.costs._end = (wclass *)0x0;
  (data->gen_cs).pred_scores.costs.end_array = (wclass *)0x0;
  return;
}

Assistant:

void finish(cb_adf& data)
{
  data.gen_cs.mtr_ec_seq.~multi_ex();
  data.cb_labels.delete_v();
  for (size_t i = 0; i < data.prepped_cs_labels.size(); i++) data.prepped_cs_labels[i].costs.delete_v();
  data.prepped_cs_labels.delete_v();
  data.cs_labels.costs.delete_v();
  data.backup_weights.delete_v();
  data.backup_nf.delete_v();
  data.prob_s.delete_v();

  data.a_s.delete_v();
  data.gen_cs.pred_scores.costs.delete_v();
}